

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

timestamp_ns_t __thiscall
duckdb::Cast::Operation<duckdb::string_t,duckdb::timestamp_ns_t>(Cast *this,string_t input)

{
  bool bVar1;
  char *str;
  timestamp_t input_00;
  ConversionException *this_00;
  timestamp_ns_t result;
  int32_t nanos;
  string_t input_local;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffffc8;
  
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  str = input_local.value.pointer.prefix;
  if (0xc < (uint)this) {
    str = input_local.value.pointer.ptr;
  }
  input_local.value._0_8_ = this;
  input_00 = Timestamp::FromCString(str,(ulong)this & 0xffffffff,(optional_ptr<int,_true>)&nanos);
  bVar1 = Timestamp::TryFromTimestampNanos(input_00,nanos,&result);
  if (bVar1) {
    return (timestamp_ns_t)(timestamp_ns_t)result.super_timestamp_t.value;
  }
  this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
  Timestamp::RangeError_abi_cxx11_((string_t)in_stack_ffffffffffffffc8);
  ConversionException::ConversionException(this_00,(string *)&stack0xffffffffffffffc8);
  __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool TryCast::Operation(bool input, uint16_t &result, bool strict) {
	return NumericTryCast::Operation<bool, uint16_t>(input, result, strict);
}